

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

char * __thiscall pybind11::cpp_function::strdup_guard::operator()(strdup_guard *this,char *s)

{
  char *local_20;
  char *t;
  char *s_local;
  strdup_guard *this_local;
  
  t = s;
  s_local = (char *)this;
  local_20 = strdup(s);
  std::vector<char_*,_std::allocator<char_*>_>::push_back(&this->strings,&local_20);
  return local_20;
}

Assistant:

char *operator()(const char *s) {
            auto *t = PYBIND11_COMPAT_STRDUP(s);
            strings.push_back(t);
            return t;
        }